

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * validateEmbeddingWeightsBias
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,WeightParams *weights,
                   WeightParams *bias)

{
  undefined8 uVar1;
  bool bVar2;
  LayerCase LVar3;
  WeightParamType WVar4;
  EmbeddingLayerParams *this;
  EmbeddingNDLayerParams *this_00;
  string *psVar5;
  uint64_t expectedUnits;
  allocator<char> local_1a1;
  string local_1a0;
  byte local_17a;
  allocator<char> local_179;
  string local_178;
  byte local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string err;
  WeightParamType biasValueType;
  WeightParamType weightsValueType;
  EmbeddingNDLayerParams *params_1;
  EmbeddingLayerParams *params;
  undefined1 local_60 [8];
  string layer_type;
  uint64_t output_channels;
  uint64_t input_dim;
  bool has_bias;
  WeightParams *bias_local;
  WeightParams *weights_local;
  NeuralNetworkLayer *layer_local;
  Result *_result;
  
  std::__cxx11::string::string((string *)local_60);
  LVar3 = CoreML::Specification::NeuralNetworkLayer::layer_case(layer);
  if (LVar3 == kEmbedding) {
    this = CoreML::Specification::NeuralNetworkLayer::embedding(layer);
    output_channels = CoreML::Specification::EmbeddingLayerParams::inputdim(this);
    layer_type.field_2._8_8_ = CoreML::Specification::EmbeddingLayerParams::outputchannels(this);
    input_dim._7_1_ = CoreML::Specification::EmbeddingLayerParams::hasbias(this);
    std::__cxx11::string::operator=((string *)local_60,"Embedding");
  }
  else {
    if (LVar3 != kEmbeddingND) {
      CoreML::Result::Result(__return_storage_ptr__);
      goto LAB_004d2ccc;
    }
    this_00 = CoreML::Specification::NeuralNetworkLayer::embeddingnd(layer);
    output_channels = CoreML::Specification::EmbeddingNDLayerParams::vocabsize(this_00);
    layer_type.field_2._8_8_ = CoreML::Specification::EmbeddingNDLayerParams::embeddingsize(this_00)
    ;
    input_dim._7_1_ = CoreML::Specification::EmbeddingNDLayerParams::hasbias(this_00);
    std::__cxx11::string::operator=((string *)local_60,"EmbeddingND");
  }
  WVar4 = CoreML::valueType(weights);
  err.field_2._12_4_ = CoreML::valueType(bias);
  uVar1 = layer_type.field_2._8_8_;
  if ((WVar4 == UNSPECIFIED) || ((input_dim._7_1_ != false && (err.field_2._12_4_ == UNSPECIFIED))))
  {
    std::operator+(&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   " \'");
    psVar5 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
    std::operator+(&local_d0,&local_f0,psVar5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   &local_d0,
                   "\' has invalid weights/bias fields. Field value types should match and should either be half or full precision."
                  );
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
  }
  else if ((input_dim._7_1_ == false) ||
          (((WVar4 != FLOAT16 || (err.field_2._12_4_ != FLOAT32)) &&
           ((WVar4 != FLOAT32 || (err.field_2._12_4_ != FLOAT16)))))) {
    local_151 = 0;
    expectedUnits = output_channels * layer_type.field_2._8_8_;
    psVar5 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"weight",&local_179);
    CoreML::validateGeneralWeightParams
              (__return_storage_ptr__,weights,expectedUnits,uVar1,(string *)local_60,psVar5,
               &local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    bVar2 = CoreML::Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_151 = 1;
    }
    if ((local_151 & 1) == 0) {
      CoreML::Result::~Result(__return_storage_ptr__);
    }
    uVar1 = layer_type.field_2._8_8_;
    if (bVar2) {
      if (input_dim._7_1_ != false) {
        local_17a = 0;
        psVar5 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"bias",&local_1a1);
        CoreML::validateGeneralWeightParams
                  (__return_storage_ptr__,bias,uVar1,1,(string *)local_60,psVar5,&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator(&local_1a1);
        bVar2 = CoreML::Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_17a = 1;
        }
        if ((local_17a & 1) == 0) {
          CoreML::Result::~Result(__return_storage_ptr__);
        }
        if (!bVar2) goto LAB_004d2ccc;
      }
      CoreML::Result::Result(__return_storage_ptr__);
    }
  }
  else {
    std::operator+(&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   " layer \'");
    psVar5 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
    std::operator+(&local_130,&local_150,psVar5);
    std::operator+(&local_110,&local_130,
                   "has unmatched precisions of weights/bias They should either be half or full precision."
                  );
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
  }
LAB_004d2ccc:
  std::__cxx11::string::~string((string *)local_60);
  return __return_storage_ptr__;
}

Assistant:

static Result validateEmbeddingWeightsBias(const Specification::NeuralNetworkLayer& layer,
                                              const Specification::WeightParams& weights,
                                              const Specification::WeightParams& bias) {
    bool has_bias;
    uint64_t input_dim;
    uint64_t output_channels;
    std::string layer_type;

    switch(layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kEmbedding: {
            const auto& params = layer.embedding();
            input_dim = params.inputdim();
            output_channels = params.outputchannels();
            has_bias = params.hasbias();
            layer_type = "Embedding";
            break;
        }
        case Specification::NeuralNetworkLayer::LayerCase::kEmbeddingND: {
            const auto& params = layer.embeddingnd();
            input_dim = params.vocabsize();
            output_channels = params.embeddingsize();
            has_bias = params.hasbias();
            layer_type = "EmbeddingND";
            break;
        }
        default:
            return Result();
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(weights);
    biasValueType = valueType(bias);

    // Only float32 or float16 parameters can be populated at any time
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)){
        std::string err = layer_type + " '" + layer.name() + "' has invalid weights/bias fields. Field value types should match and should either be half or full precision.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            return Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() +
                          "has unmatched precisions of weights/bias They should either be half or full precision.");
        }
    }
    // Validate weight and bias sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weights, input_dim * output_channels, output_channels,
                                                                  layer_type, layer.name(), "weight"));
    if (has_bias){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(bias, output_channels, 1,
                                                                      layer_type, layer.name(), "bias"));
    }

    return Result();
}